

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O3

void Hop_ObjConnect(Hop_Man_t *p,Hop_Obj_t *pObj,Hop_Obj_t *pFan0,Hop_Obj_t *pFan1)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0x7f,"void Hop_ObjConnect(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Obj_t *)");
  }
  uVar2 = *(uint *)&pObj->field_0x20;
  if ((uVar2 & 6) == 4) {
    pObj->pFanin0 = pFan0;
    pObj->pFanin1 = pFan1;
    if (p->fRefCount == 0) {
      uVar4 = *(uint *)(((ulong)pFan0 & 0xfffffffffffffffe) + 0x20) >> 6;
      uVar3 = *(uint *)(((ulong)pFan1 & 0xfffffffffffffffe) + 0x20) >> 6;
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      *(uint *)&pObj->field_0x20 = (uVar2 & 0x3d) + (uVar3 + ((~uVar2 & 5) == 0)) * 0x40 + 0x40;
    }
    else {
      if (pFan0 != (Hop_Obj_t *)0x0) {
        piVar1 = (int *)(((ulong)pFan0 & 0xfffffffffffffffe) + 0x20);
        *piVar1 = *piVar1 + 0x40;
      }
      if (pFan1 != (Hop_Obj_t *)0x0) {
        piVar1 = (int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x20);
        *piVar1 = *piVar1 + 0x40;
      }
    }
    if (((ulong)pFan0 & 1) == 0) {
      uVar2 = *(uint *)&pFan0->field_0x20;
    }
    else {
      uVar2 = ~*(uint *)(((ulong)pFan0 & 0xfffffffffffffffe) + 0x20);
    }
    if (((ulong)pFan1 & 1) == 0) {
      uVar3 = *(uint *)&pFan1->field_0x20;
    }
    else {
      uVar3 = ~*(uint *)(((ulong)pFan1 & 0xfffffffffffffffe) + 0x20);
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xfffffff7 | uVar3 & 8 & uVar2 & 8;
    Hop_TableInsert(p,pObj);
    return;
  }
  __assert_fail("Hop_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                ,0x80,"void Hop_ObjConnect(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Obj_t *)");
}

Assistant:

void Hop_ObjConnect( Hop_Man_t * p, Hop_Obj_t * pObj, Hop_Obj_t * pFan0, Hop_Obj_t * pFan1 )
{
    assert( !Hop_IsComplement(pObj) );
    assert( Hop_ObjIsNode(pObj) );
    // add the first fanin
    pObj->pFanin0 = pFan0;
    pObj->pFanin1 = pFan1;
    // increment references of the fanins and add their fanouts
    if ( p->fRefCount )
    {
        if ( pFan0 != NULL )
            Hop_ObjRef( Hop_ObjFanin0(pObj) );
        if ( pFan1 != NULL )
            Hop_ObjRef( Hop_ObjFanin1(pObj) );
    }
    else
        pObj->nRefs = Hop_ObjLevelNew( pObj );
    // set the phase
    pObj->fPhase = Hop_ObjPhaseCompl(pFan0) & Hop_ObjPhaseCompl(pFan1);
    // add the node to the structural hash table
    Hop_TableInsert( p, pObj );
}